

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_lengthi<char,char32_t>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix)

{
  wchar32 wVar1;
  bool bVar2;
  char32_t cVar3;
  wchar32 *pwVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  jessilib *this;
  char *pcVar8;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  size_t local_40;
  
  pwVar4 = in_prefix._M_str;
  pcVar5 = (char *)in_prefix._M_len;
  pcVar7 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  local_40 = 0;
  pcVar8 = pcVar5;
  do {
    if ((this == (jessilib *)0x0) || (pcVar8 == (char *)0x0)) {
      if (pcVar8 != (char *)0x0) {
        return 0;
      }
      return local_40;
    }
    in_string_00._M_str = pcVar5;
    in_string_00._M_len = (size_t)pcVar7;
    dVar9 = decode_codepoint_utf8<char>(this,in_string_00);
    sVar6 = dVar9.units;
    if (sVar6 == 0) {
LAB_00261ac8:
      pcVar5 = (char *)dVar9.units;
      bVar2 = false;
    }
    else {
      wVar1 = *pwVar4;
      if (dVar9.codepoint != wVar1) {
        cVar3 = jessilib::fold(dVar9.codepoint);
        dVar9 = (decode_result)jessilib::fold(wVar1);
        if (cVar3 != dVar9.codepoint) goto LAB_00261ac8;
      }
      pcVar5 = (char *)dVar9.units;
      pcVar7 = pcVar7 + sVar6;
      this = this + -sVar6;
      pwVar4 = pwVar4 + 1;
      pcVar8 = pcVar8 + -1;
      local_40 = local_40 + sVar6;
      bVar2 = true;
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}